

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void plan(int count)

{
  int count_local;
  
  level = level + 1;
  plan_test[level] = count;
  tests_done[level] = 0;
  tests_failed[level] = 0;
  if (level == 0) {
    printf("TAP version 13\n");
  }
  _space(_stdout);
  printf("%d..%d\n",1,(ulong)(uint)plan_test[level]);
  return;
}

Assistant:

void
plan(int count)
{
	++level;
	plan_test[level] = count;
	tests_done[level] = 0;
	tests_failed[level] = 0;

	if (level == 0)
		printf("TAP version 13\n");

	_space(stdout);
	printf("%d..%d\n", 1, plan_test[level]);
}